

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O3

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,ForLoopStatement *stmt)

{
  size_t sVar1;
  pointer ppEVar2;
  pointer ppVVar3;
  __extent_storage<18446744073709551615UL> _Var4;
  bool bVar5;
  Expression *pEVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> loopVars;
  type oldBreakStates;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_70;
  char local_50;
  
  sVar1 = (stmt->initializers)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (stmt->initializers)._M_ptr;
    lVar8 = 0;
    do {
      pEVar6 = *(Expression **)((long)ppEVar2 + lVar8);
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (pEVar6,pEVar6,(TestAnalysis *)this);
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  sVar1 = (stmt->loopVars)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppVVar3 = (stmt->loopVars)._M_ptr;
    lVar8 = 0;
    do {
      pEVar6 = ast::DeclaredType::getInitializer
                         ((DeclaredType *)(*(long *)((long)ppVVar3 + lVar8) + 0x40));
      if (pEVar6 != (Expression *)0x0) {
        ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                  (pEVar6,pEVar6,(TestAnalysis *)this);
      }
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  pEVar6 = stmt->stopExpr;
  if (pEVar6 == (Expression *)0x0) {
    iVar7 = this->state;
    iVar9 = 0;
    bVar5 = false;
  }
  else {
    bVar5 = this->inCondition;
    this->inCondition = true;
    ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
              (pEVar6,pEVar6,(TestAnalysis *)this);
    this->inCondition = bVar5;
    adjustConditionalState((ConstantValue *)&local_70,this,pEVar6);
    iVar7 = this->stateWhenTrue;
    iVar9 = this->stateWhenFalse;
    _Var4._M_extent_value = (stmt->loopVars)._M_extent._M_extent_value;
    if (_Var4._M_extent_value == 0 || local_50 != '\0') {
      bVar5 = false;
    }
    else {
      loopVars._M_extent._M_extent_value = _Var4._M_extent_value;
      loopVars._M_ptr = (stmt->loopVars)._M_ptr;
      bVar5 = FlowAnalysisBase::willIterateAtLeastOnce
                        (&this->super_FlowAnalysisBase,loopVars,stmt->stopExpr);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_70);
  }
  SmallVector<int,_10UL>::SmallVector
            ((SmallVector<int,_10UL> *)&local_70,&(this->breakStates).super_SmallVectorBase<int>);
  (this->breakStates).super_SmallVectorBase<int>.len = 0;
  this->isStateSplit = false;
  this->state = iVar7;
  this->stateWhenTrue = 0;
  this->stateWhenFalse = 0;
  ast::Statement::visit<TestAnalysis&>(stmt->body,(TestAnalysis *)this);
  sVar1 = (stmt->steps)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (stmt->steps)._M_ptr;
    lVar8 = 0;
    do {
      pEVar6 = *(Expression **)((long)ppEVar2 + lVar8);
      ast::Expression::visitExpression<slang::ast::Expression_const,TestAnalysis&>
                (pEVar6,pEVar6,(TestAnalysis *)this);
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  iVar7 = this->state;
  if (iVar9 <= this->state) {
    iVar7 = iVar9;
  }
  if (bVar5 == false) {
    iVar7 = iVar9;
  }
  loopTail(this,iVar7,(SmallVector<int,_10UL> *)&local_70);
  if ((void *)local_70._0_8_ != (void *)((long)&local_70 + 0x18)) {
    operator_delete((void *)local_70._0_8_);
  }
  return;
}

Assistant:

void visitStmt(const ForLoopStatement& stmt) {
        for (auto init : stmt.initializers)
            visit(*init);

        for (auto var : stmt.loopVars) {
            if (auto init = var->getInitializer())
                visit(*init);
        }

        bool bodyWillExecute = false;
        TState bodyState, exitState;
        if (stmt.stopExpr) {
            auto cv = visitCondition(*stmt.stopExpr);
            bodyState = std::move(stateWhenTrue);
            exitState = std::move(stateWhenFalse);

            // If we had a non-constant stop expression we want
            // to check whether there's at least a guarantee that
            // we will visit the loop body at least once, because then
            // we can allow the body state to definitely affect the
            // post-loop exit state.
            if (!cv && !stmt.loopVars.empty() &&
                willIterateAtLeastOnce(stmt.loopVars, *stmt.stopExpr)) {
                bodyWillExecute = true;
            }
        }
        else {
            // If there's no stop expression, the loop is infinite.
            bodyState = std::move(state);
            exitState = (DERIVED).unreachableState();
        }

        auto oldBreakStates = std::move(breakStates);
        breakStates.clear();
        setState(std::move(bodyState));
        visit(stmt.body);

        for (auto step : stmt.steps)
            visit(*step);

        if (bodyWillExecute)
            (DERIVED).meetState(exitState, state);

        loopTail(std::move(exitState), std::move(oldBreakStates));
    }